

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O0

bool __thiscall ami_nvar_t::nvar_entry_t::_is_null_signature_rest(nvar_entry_t *this)

{
  string local_30;
  nvar_entry_t *local_10;
  nvar_entry_t *this_local;
  
  local_10 = this;
  signature_rest_abi_cxx11_(&local_30,this);
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)(this->n_signature_rest & 1);
}

Assistant:

bool _is_null_signature_rest() { signature_rest(); return n_signature_rest; }